

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

UniValue * __thiscall UniValue::operator[](UniValue *this,size_t index)

{
  pointer pUVar1;
  UniValue *pUVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  if ((this->typ - VOBJ < 2) &&
     (pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start,
     uVar3 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3,
     index <= uVar3 && uVar3 - index != 0)) {
    pUVar2 = pUVar1 + index;
  }
  else {
    pUVar2 = &NullUniValue;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pUVar2;
  }
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::operator[](size_t index) const
{
    if (typ != VOBJ && typ != VARR)
        return NullUniValue;
    if (index >= values.size())
        return NullUniValue;

    return values.at(index);
}